

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool ON_ReparameterizeRationalNurbsCurve
               (double c,int dim,int order,int cv_count,int cvstride,double *cv,double *knot)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  double x;
  double dVar12;
  double dVar13;
  
  bVar4 = ON_IsValid(c);
  if (bVar4) {
    x = c + -1.0;
    bVar4 = ON_IsValid(x);
    if (c != 0.0 && bVar4) {
      if ((c != 1.0) || (NAN(c))) {
        iVar11 = order + -2;
        dVar2 = knot[iVar11];
        lVar5 = (long)cv_count;
        dVar3 = knot[lVar5 + -1];
        dVar12 = dVar3 - dVar2;
        bVar4 = ON_IsValid(dVar12);
        if (!bVar4) {
          return false;
        }
        if (dVar12 <= 0.0) {
          return false;
        }
        uVar1 = iVar11 + cv_count;
        if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            dVar13 = (knot[uVar6] - dVar2) * (1.0 / dVar12);
            knot[uVar6] = (dVar13 * c) / (x * dVar13 + 1.0);
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        if (0 < cv_count) {
          iVar7 = 0;
          do {
            dVar12 = *knot * -x + c;
            lVar8 = (long)iVar11;
            if (iVar11 != 0) {
              do {
                dVar12 = dVar12 * (knot[lVar8] * -x + c);
                lVar8 = lVar8 + -1;
              } while (lVar8 != 0);
            }
            dVar13 = cv[dim];
            pdVar10 = cv;
            iVar9 = dim;
            if (dim != 0) {
              do {
                cv = pdVar10 + 1;
                *pdVar10 = *pdVar10 * dVar12;
                iVar9 = iVar9 + -1;
                pdVar10 = cv;
              } while (iVar9 != 0);
            }
            knot = knot + 1;
            *cv = dVar13 * dVar12;
            cv = cv + (long)(~dim + cvstride) + 1;
            iVar7 = iVar7 + 1;
          } while (iVar7 != cv_count);
        }
        if (0 < (int)uVar1) {
          uVar6 = 0;
          do {
            knot[uVar6 - lVar5] = (1.0 - knot[uVar6 - lVar5]) * dVar2 + knot[uVar6 - lVar5] * dVar3;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ReparameterizeRationalNurbsCurve(
          double c, 
          int dim, 
          int order, 
          int cv_count,
          int cvstride,
          double* cv,
          double* knot
          )
{
  // Reference
  //  E. T. Y. Lee and M. L. Lucian 
  //  Mobius reparameterization of rational B-splines
  //  CAGD Vol8 pp 213-215 1991
  const double c1 = c-1.0;
  double k0, k1, k, d, w0, w1;
  int i,j;

  if ( !ON_IsValid(c) || !ON_IsValid(c1) || 0.0 == c )
    return false;

  if ( 1.0 == c )
    return true;

  // change domain to [0,1] and then adjust knots
  k0 = knot[order-2];
  k1 = knot[cv_count-1];
  d = k1 - k0;
  if ( !ON_IsValid(d) || d <= 0.0 )
    return false;
  d = 1.0/d;
  j = cv_count+order-2;
  for ( i = 0; i < j; i++ )
  {
    k = knot[i];
    k = (k - k0)*d;
    knot[i] = c*k/(c1*k+1.0);
  }

  // adjust cvs
  order -= 2;
  cvstride -= (dim+1);
  for ( i = 0; i < cv_count; i++ )
  {
    d = c - c1*(*knot++);
    j = order;
    while(j--)
    {
      d *= c - c1*knot[j];
    }
    w0 = cv[dim];
    w1 = w0*d;
    j = dim;
    while(j--)
      *cv++ *= d;
    *cv++ = w1;
    cv += cvstride;
  }
  order += 2;
  cvstride += (dim+1);
  cv -= cv_count*cvstride;
  knot -= cv_count;

  // change domain back to [k0,k1]
  j = cv_count+order-2;
  for ( i = 0; i < j; i++ )
  {
    k = knot[i];
    knot[i] = (1.0-k)*k0 + k*k1;
  }

  return true;
}